

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O3

Result __thiscall wabt::FileStream::WriteDataImpl(FileStream *this,size_t at,void *data,size_t size)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  Enum EVar3;
  
  __stream = (FILE *)this->file_;
  EVar3 = Error;
  if (__stream != (FILE *)0x0) {
    if (size != 0) {
      if (this->offset_ != at) {
        iVar1 = fseek(__stream,at,0);
        if (iVar1 != 0) {
          WriteDataImpl((FileStream *)size);
          return (Result)Error;
        }
        this->offset_ = at;
        __stream = (FILE *)this->file_;
      }
      sVar2 = fwrite(data,size,1,__stream);
      if (sVar2 != 1) {
        WriteDataImpl((FileStream *)size);
        return (Result)Error;
      }
      this->offset_ = this->offset_ + size;
    }
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result FileStream::WriteDataImpl(size_t at, const void* data, size_t size) {
  if (!file_) {
    return Result::Error;
  }
  if (size == 0) {
    return Result::Ok;
  }
  if (at != offset_) {
    if (fseek(file_, at, SEEK_SET) != 0) {
      ERROR("fseek offset=%" PRIzd " failed, errno=%d\n", size, errno);
      return Result::Error;
    }
    offset_ = at;
  }
  if (fwrite(data, size, 1, file_) != 1) {
    ERROR("fwrite size=%" PRIzd " failed, errno=%d\n", size, errno);
    return Result::Error;
  }
  offset_ += size;
  return Result::Ok;
}